

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

string * __thiscall
LiteScript::Type::ToString_abi_cxx11_(string *__return_storage_ptr__,Type *this,Variable *param_1)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::Type::ToString(const LiteScript::Variable&) const { return this->name; }